

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

ssize_t __thiscall r_comp::Metadata::read(Metadata *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<r_comp::Class> *this_00;
  size_t sVar1;
  long lVar2;
  Class *pCVar3;
  mapped_type *pmVar4;
  Metadata *pMVar5;
  void *__buf_00;
  long lVar6;
  undefined4 in_register_00000034;
  uint *puVar7;
  ulong uVar8;
  bool bVar9;
  Class c;
  value_type local_d8;
  value_type local_b8;
  value_type local_98;
  Class local_78;
  
  puVar7 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar8 = (ulong)*puVar7;
  this_00 = &this->classes_by_opcodes;
  lVar6 = 1;
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    Class::Class(&c,ANY);
    Class::read(&c,(int)lVar6 * 4 + __fd,__buf_00,__nbytes);
    Class::Class(&local_78,&c);
    std::vector<r_comp::Class,_std::allocator<r_comp::Class>_>::push_back
              (&this_00->m_vector,&local_78);
    Class::~Class(&local_78);
    sVar1 = Class::get_size(&c);
    lVar6 = lVar6 + sVar1;
    Class::~Class(&c);
  }
  uVar8 = (ulong)puVar7[lVar6];
  while( true ) {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    r_code::ReadString_abi_cxx11_((uint *)&c);
    lVar2 = r_code::GetStringSize((string *)&c);
    lVar6 = lVar6 + 1 + lVar2;
    pCVar3 = r_code::vector<r_comp::Class>::operator[](this_00,(ulong)puVar7[lVar6]);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,(key_type *)&c);
    Class::operator=(pmVar4,pCVar3);
    std::__cxx11::string::~string((string *)&c);
  }
  lVar2 = lVar6 + 2;
  uVar8 = (ulong)puVar7[lVar6 + 1];
  while( true ) {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    r_code::ReadString_abi_cxx11_((uint *)&c);
    lVar6 = r_code::GetStringSize((string *)&c);
    pCVar3 = r_code::vector<r_comp::Class>::operator[](this_00,(ulong)puVar7[lVar6 + lVar2]);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->sys_classes,(key_type *)&c);
    Class::operator=(pmVar4,pCVar3);
    lVar2 = lVar2 + lVar6 + 1;
    std::__cxx11::string::~string((string *)&c);
  }
  lVar6 = lVar2 + 1;
  uVar8 = (ulong)puVar7[lVar2];
  while( true ) {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    r_code::ReadString_abi_cxx11_((uint *)&c);
    std::__cxx11::string::string((string *)&local_98,(string *)&c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->class_names).m_vector,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    lVar2 = r_code::GetStringSize((string *)&c);
    lVar6 = lVar6 + lVar2;
    std::__cxx11::string::~string((string *)&c);
  }
  lVar2 = lVar6 + 1;
  uVar8 = (ulong)puVar7[lVar6];
  pMVar5 = this;
  while( true ) {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    r_code::ReadString_abi_cxx11_((uint *)&c);
    std::__cxx11::string::string((string *)&local_b8,(string *)&c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->operator_names).m_vector,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar6 = r_code::GetStringSize((string *)&c);
    lVar2 = lVar2 + lVar6;
    pMVar5 = (Metadata *)std::__cxx11::string::~string((string *)&c);
  }
  uVar8 = (ulong)puVar7[lVar2];
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    r_code::ReadString_abi_cxx11_((uint *)&c);
    std::__cxx11::string::string((string *)&local_d8,(string *)&c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->function_names).m_vector,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    r_code::GetStringSize((string *)&c);
    pMVar5 = (Metadata *)std::__cxx11::string::~string((string *)&c);
  }
  return (ssize_t)pMVar5;
}

Assistant:

void Metadata::read(uint32_t *data, size_t size)
{
    size_t class_count = data[0];
    size_t i;
    size_t offset = 1;

    for (i = 0; i < class_count; ++i) {
        Class c;
        c.read(data + offset);
        classes_by_opcodes.push_back(c);
        offset += c.get_size();
    }

    size_t classes_count = data[offset++];

    for (i = 0; i < classes_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        offset += r_code::GetStringSize(name);
        classes[name] = classes_by_opcodes[data[offset++]];
    }

    size_t sys_classes_count = data[offset++];

    for (i = 0; i < sys_classes_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        offset += r_code::GetStringSize(name);
        sys_classes[name] = classes_by_opcodes[data[offset++]];
    }

    size_t class_names_count = data[offset++];

    for (i = 0; i < class_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        class_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }

    size_t operator_names_count = data[offset++];

    for (i = 0; i < operator_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        operator_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }

    size_t function_names_count = data[offset++];

    for (i = 0; i < function_names_count; ++i) {
        std::string name = r_code::ReadString(data + offset);
        function_names.push_back(name);
        offset += r_code::GetStringSize(name);
    }
}